

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

AggregateFunction *
duckdb::ContinuousQuantileListFunction::GetAggregate
          (AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  LogicalType list_of_double;
  LogicalType local_40;
  LogicalType local_28;
  
  GetContinuousQuantileTemplated<duckdb::ListContinuousQuantile>(__return_storage_ptr__,type);
  ::std::__cxx11::string::_M_replace
            ((ulong)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                     super_Function.name,0,
             (char *)(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                     super_Function.name._M_string_length,0x1d87f30);
  __return_storage_ptr__->bind = Bind;
  __return_storage_ptr__->serialize = QuantileBindData::Serialize;
  __return_storage_ptr__->deserialize = Deserialize;
  LogicalType::LogicalType(&local_40,DOUBLE);
  LogicalType::LIST(&local_28,&local_40);
  LogicalType::~LogicalType(&local_40);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.arguments,
             &local_28);
  __return_storage_ptr__->order_dependent = NOT_ORDER_DEPENDENT;
  LogicalType::~LogicalType(&local_28);
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction GetAggregate(const LogicalType &type) {
		auto fun = GetContinuousQuantileList(type);
		fun.name = "quantile_cont";
		fun.bind = Bind;
		fun.serialize = QuantileBindData::Serialize;
		fun.deserialize = Deserialize;
		// temporarily push an argument so we can bind the actual quantile
		auto list_of_double = LogicalType::LIST(LogicalType::DOUBLE);
		fun.arguments.push_back(list_of_double);
		fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		return fun;
	}